

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int time_iseasterday(void)

{
  uint uVar1;
  tm *ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long in_FS_OFFSET;
  time_t time_data;
  time_t time_data_now;
  long local_38;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  time(&local_30);
  ptVar2 = localtime(&local_30);
  iVar3 = ptVar2->tm_year + 0x76c;
  iVar8 = iVar3 >> 0x1f;
  iVar7 = iVar3 / 100 + iVar8;
  uVar6 = iVar7 - iVar8;
  iVar4 = iVar3 + uVar6 * -100;
  iVar5 = (int)((ulong)((long)iVar3 * -0x51eb851f) >> 0x20);
  uVar1 = (iVar7 - iVar8) + 3;
  if (-1 < (int)uVar6) {
    uVar1 = uVar6;
  }
  iVar8 = (int)((ulong)((long)((iVar7 - iVar8) + 8) * -0x51eb851f) >> 0x20);
  iVar8 = ((iVar8 >> 3) - (iVar8 >> 0x1f)) + uVar6 + 1;
  iVar8 = (int)((ulong)((long)iVar8 * 0x55555555) >> 0x20) - iVar8;
  iVar7 = (iVar8 >> 1) - (iVar8 >> 0x1f);
  iVar5 = ((iVar5 >> 7) - (iVar5 >> 0x1f)) + uVar6 + (iVar3 % 0x13) * 0x13;
  iVar8 = iVar5 + iVar7;
  iVar5 = (int)((ulong)((long)(iVar5 + iVar7 + 0xf) * -0x77777777) >> 0x20) + iVar8 + 0xf;
  iVar5 = ((iVar5 >> 4) - (iVar5 >> 0x1f)) * -0x1e + iVar8 + 0xf;
  iVar8 = iVar4 + 3;
  if (-1 < iVar4) {
    iVar8 = iVar4;
  }
  iVar4 = ((iVar8 >> 2) + (uVar6 - (uVar1 & 0x7ffffffc))) * 2 - (iVar4 % 4 + iVar5);
  iVar8 = (int)((ulong)((long)(iVar4 + 0x20) * -0x6db6db6d) >> 0x20) + iVar4 + 0x20;
  iVar8 = ((iVar8 >> 2) - (iVar8 >> 0x1f)) * -7 + iVar4 + 0x20;
  uVar1 = ((iVar8 * 0x16 + iVar5 * 0xb + iVar3 % 0x13) / 0x1c3) * -7 + iVar5 + iVar8 + 0x72;
  lVar9 = -0x15180;
  while( true ) {
    local_38 = local_30 + lVar9;
    ptVar2 = localtime(&local_38);
    if ((ptVar2->tm_mon == uVar1 / 0x1f - 1) && (ptVar2->tm_mday == uVar1 % 0x1f + 1)) break;
    lVar9 = lVar9 + 0x15180;
    if (lVar9 == 0x3f480) {
      iVar8 = 0;
LAB_001d2a6e:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return iVar8;
      }
      __stack_chk_fail();
    }
  }
  iVar8 = 1;
  goto LAB_001d2a6e;
}

Assistant:

int time_iseasterday()
{
	time_t time_data_now, time_data;
	struct tm *time_info;
	int Y, a, b, c, d, e, f, g, h, i, k, L, m, month, day, day_offset;

	time(&time_data_now);
	time_info = localtime(&time_data_now);

	// compute Easter day (Sunday) using https://en.wikipedia.org/w/index.php?title=Computus&oldid=890710285#Anonymous_Gregorian_algorithm
	Y = time_info->tm_year + 1900;
	a = Y % 19;
	b = Y / 100;
	c = Y % 100;
	d = b / 4;
	e = b % 4;
	f = (b + 8) / 25;
	g = (b - f + 1) / 3;
	h = (19 * a + b - d - g + 15) % 30;
	i = c / 4;
	k = c % 4;
	L = (32 + 2 * e + 2 * i - h - k) % 7;
	m = (a + 11 * h + 22 * L) / 451;
	month = (h + L - 7 * m + 114) / 31;
	day = ((h + L - 7 * m + 114) % 31) + 1;

	// (now-1d ≤ easter ≤ now+2d) <=> (easter-2d ≤ now ≤ easter+1d) <=> (Good Friday ≤ now ≤ Easter Monday)
	for(day_offset = -1; day_offset <= 2; day_offset++)
	{
		time_data = time_data_now + day_offset*(60*60*24);
		time_info = localtime(&time_data);

		if(time_info->tm_mon == month-1 && time_info->tm_mday == day)
			return 1;
	}
	return 0;
}